

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_cluster.cpp
# Opt level: O0

MPP_RET mpp_node_set_func(MppNode node,TaskProc proc,void *param)

{
  MppNodeImpl *p;
  void *param_local;
  TaskProc proc_local;
  MppNode node_local;
  
  if (node == (MppNode)0x0) {
    node_local._4_4_ = MPP_NOK;
  }
  else {
    *(TaskProc *)((long)node + 0x28) = proc;
    *(void **)((long)node + 0x30) = param;
    node_local._4_4_ = MPP_OK;
  }
  return node_local._4_4_;
}

Assistant:

MPP_RET mpp_node_set_func(MppNode node, TaskProc proc, void *param)
{
    MppNodeImpl *p = (MppNodeImpl *)node;
    if (!p)
        return MPP_NOK;

    p->work.proc = proc;
    p->work.param = param;

    return MPP_OK;
}